

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

btVector3 __thiscall btMultiBody::worldPosToLocal(btMultiBody *this,int i,btVector3 *world_pos)

{
  btVector3 *v2;
  btQuaternion *pbVar1;
  undefined8 in_RDX;
  int in_ESI;
  btMultiBody *in_RDI;
  btVector3 bVar2;
  undefined8 in_stack_ffffffffffffff88;
  int i_00;
  btMultiBody *in_stack_ffffffffffffff90;
  btVector3 *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffb8 [16];
  undefined8 local_38;
  int i_01;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_10 [16];
  
  i_01 = (int)((ulong)in_RDX >> 0x20);
  if (in_ESI == -1) {
    v2 = (btVector3 *)getWorldToBaseRot(in_RDI);
    getBasePos(in_RDI);
    operator-((btVector3 *)in_RDI,v2);
    local_10 = (undefined1  [16])
               quatRotate(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
  }
  else {
    pbVar1 = getParentToLocalRot(in_stack_ffffffffffffff90,
                                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    i_00 = (int)((ulong)pbVar1 >> 0x20);
    getParent(in_stack_ffffffffffffff90,i_00);
    worldPosToLocal((btMultiBody *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),i_01,local_38);
    quatRotate(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
    getRVector(in_stack_ffffffffffffff90,i_00);
    local_10 = (undefined1  [16])operator-((btVector3 *)in_RDI,in_stack_ffffffffffffff98);
  }
  bVar2.m_floats[0] = (btScalar)local_10._0_4_;
  bVar2.m_floats[1] = (btScalar)local_10._4_4_;
  bVar2.m_floats[2] = (btScalar)local_10._8_4_;
  bVar2.m_floats[3] = (btScalar)local_10._12_4_;
  return (btVector3)bVar2.m_floats;
}

Assistant:

btVector3 btMultiBody::worldPosToLocal(int i, const btVector3 &world_pos) const
{
    if (i == -1) {
        // world to base
        return quatRotate(getWorldToBaseRot(),(world_pos - getBasePos()));
    } else {
        // find position in parent frame, then transform to current frame
        return quatRotate(getParentToLocalRot(i),worldPosToLocal(getParent(i), world_pos)) - getRVector(i);
    }
}